

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

InterfaceSchema __thiscall capnp::Type::asInterface(Type *this)

{
  bool bVar1;
  Schema local_80;
  Fault local_78;
  Fault f_1;
  RawBrandedSchema **local_68;
  undefined1 local_60 [8];
  DebugComparison<const_capnp::_::RawBrandedSchema_*const_&,_std::nullptr_t> _kjCondition_1;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Type *this_local;
  
  f.exception._6_1_ = isInterface(this);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    local_68 = (RawBrandedSchema **)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&(this->field_4).schema);
    f_1.exception = (Exception *)0x0;
    kj::_::DebugExpression<capnp::_::RawBrandedSchema_const*const&>::operator!=
              ((DebugComparison<const_capnp::_::RawBrandedSchema_*const_&,_std::nullptr_t> *)
               local_60,(DebugExpression<capnp::_::RawBrandedSchema_const*const&> *)&local_68,
               &f_1.exception);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawBrandedSchema_const*const&,decltype(nullptr)>&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x30e,FAILED,"schema != nullptr","_kjCondition,",
                 (DebugComparison<const_capnp::_::RawBrandedSchema_*const_&,_std::nullptr_t> *)
                 local_60);
      kj::_::Debug::Fault::fatal(&local_78);
    }
    Schema::Schema(&local_80,(this->field_4).schema);
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local,local_80);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[57]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x30b,FAILED,"isInterface()",
               "_kjCondition,\"Tried to interpret a non-interface type as an interface.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [57])"Tried to interpret a non-interface type as an interface.");
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  return (InterfaceSchema)(Schema)this_local;
}

Assistant:

InterfaceSchema Type::asInterface() const {
  KJ_REQUIRE(isInterface(), "Tried to interpret a non-interface type as an interface.") {
    return InterfaceSchema();
  }
  KJ_ASSERT(schema != nullptr);
  return InterfaceSchema(Schema(schema));
}